

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeRegExp * __thiscall Parser::ParseRegExp<true>(Parser *this)

{
  BOOL BVar1;
  code *pcVar2;
  bool bVar3;
  Scanner_t *this_00;
  ParseNodeType *pnode_00;
  RegexPattern *pRVar4;
  undefined4 *puVar5;
  BOOL saveDeferringAST;
  ParseNodeRegExp *pnode;
  Parser *this_local;
  
  this_00 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExp(this_00);
  BVar1 = this->m_deferringAST;
  if ((this->m_doingFastScan & 1U) != 0) {
    this->m_deferringAST = 0;
  }
  pnode_00 = CreateNodeForOpT<(OpCode)7>(this);
  pRVar4 = Token::GetRegex((Token *)&this->m_token);
  pnode_00->regexPattern = pRVar4;
  if ((this->m_doingFastScan & 1U) == 0) {
    bVar3 = IsBackgroundParser(this);
    if (bVar3) {
      if (pnode_00->regexPattern != (RegexPattern *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0xf03,"(pnode->regexPattern == nullptr)",
                           "pnode->regexPattern == nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      AddBackgroundRegExpNode(this,&pnode_00->super_ParseNode);
    }
  }
  else {
    this->m_deferringAST = BVar1;
    AddFastScannedRegExpNode(this,&pnode_00->super_ParseNode);
  }
  if ((this->m_token).tk != tkRegExp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xf0c,"(m_token.tk == tkRegExp)","m_token.tk == tkRegExp");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return pnode_00;
}

Assistant:

ParseNodeRegExp * Parser::ParseRegExp()
{
    ParseNodeRegExp * pnode = nullptr;

    if (buildAST || IsDoingFastScan())
    {
        this->GetScanner()->RescanRegExp();

#if ENABLE_BACKGROUND_PARSING
        BOOL saveDeferringAST = this->m_deferringAST;
        if (m_doingFastScan)
        {
            this->m_deferringAST = false;
        }
#endif
        pnode = CreateNodeForOpT<knopRegExp>();
        pnode->regexPattern = m_token.GetRegex();
#if ENABLE_BACKGROUND_PARSING
        if (m_doingFastScan)
        {
            this->m_deferringAST = saveDeferringAST;
            this->AddFastScannedRegExpNode(pnode);
            if (!buildAST)
            {
                pnode = nullptr;
            }
        }
        else if (this->IsBackgroundParser())
        {
            Assert(pnode->regexPattern == nullptr);
            this->AddBackgroundRegExpNode(pnode);
        }
#endif
    }
    else
    {
        this->GetScanner()->RescanRegExpNoAST();
    }
    Assert(m_token.tk == tkRegExp);

    return pnode;
}